

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

void PostProcess(Mat *frame,vector<cv::Mat,_std::allocator<cv::Mat>_> *outs,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *classes,double *confThreshold,double *nmsThreshold)

{
  pointer pMVar1;
  Mat *frame_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  pointer pMVar3;
  _InputArray *p_Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  float *pfVar9;
  Point classIdPoint;
  double confidence;
  vector<float,_std::allocator<float>_> confidences;
  vector<int,_std::allocator<int>_> classIds;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> boxes;
  Rect box;
  vector<int,_std::allocator<int>_> indices;
  Range local_198;
  Range local_190;
  float local_188;
  float local_184;
  float local_180;
  float local_17c;
  vector<float,_std::allocator<float>_> local_178;
  void *local_158;
  iterator iStack_150;
  int *local_148;
  Mat *local_138;
  double *local_130;
  void *local_128;
  undefined8 uStack_120;
  long local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  double *local_108;
  ulong local_100;
  _InputArray local_f8 [4];
  Range local_98;
  Range RStack_90;
  long local_88;
  
  local_158 = (void *)0x0;
  iStack_150._M_current = (int *)0x0;
  local_148 = (int *)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_118 = 0;
  local_128 = (void *)0x0;
  uStack_120 = 0;
  pMVar3 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_138 = frame;
  local_130 = confThreshold;
  local_110 = classes;
  local_108 = nmsThreshold;
  if ((outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pMVar3) {
    uVar7 = 0;
    do {
      pMVar1 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = uVar7 * 0x60;
      local_100 = uVar7;
      if (0 < *(int *)(pMVar1 + lVar8 + 8)) {
        pfVar9 = *(float **)(pMVar3 + lVar8 + 0x10);
        local_98.start = 0;
        do {
          iVar5 = local_98.start + 1;
          local_98.end = iVar5;
          local_198.start = -0x80000000;
          local_198.end = 0x7fffffff;
          cv::Mat::Mat((Mat *)local_f8,pMVar1 + lVar8,&local_98,&local_198);
          local_190.end =
               *(int *)((outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                        super__Vector_impl_data._M_start + lVar8 + 0xc);
          local_198.start = -0x80000000;
          local_198.end = 0x7fffffff;
          local_190.start = 5;
          cv::Mat::Mat((Mat *)&local_98,(Mat *)local_f8,&local_198,&local_190);
          cv::Mat::~Mat((Mat *)local_f8);
          local_198.start = 0;
          local_198.end = 0;
          local_f8[0].sz.width = 0;
          local_f8[0].sz.height = 0;
          local_f8[0].flags = 0x1010000;
          local_f8[0].obj = &local_98;
          p_Var4 = (_InputArray *)cv::noArray();
          cv::minMaxLoc(local_f8,(double *)0x0,(double *)&local_190,(Point_ *)0x0,
                        (Point_ *)&local_198,p_Var4);
          if (*local_130 <= (double)CONCAT44(local_190.end,local_190.start) &&
              (double)CONCAT44(local_190.end,local_190.start) != *local_130) {
            local_184 = *pfVar9 * (float)*(int *)(local_138 + 0xc);
            local_188 = pfVar9[1] * (float)*(int *)(local_138 + 8);
            local_17c = (float)*(int *)(local_138 + 0xc) * pfVar9[2];
            local_180 = (float)*(int *)(local_138 + 8) * pfVar9[3];
            if (iStack_150._M_current == local_148) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_158,iStack_150,&local_198.start);
            }
            else {
              *iStack_150._M_current = local_198.start;
              iStack_150._M_current = iStack_150._M_current + 1;
            }
            local_f8[0].flags = (int)(float)(double)CONCAT44(local_190.end,local_190.start);
            if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                        (&local_178,
                         (iterator)
                         local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(float *)local_f8);
            }
            else {
              *local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = (float)local_f8[0].flags;
              local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            local_f8[0].flags = (int)local_184 - (int)local_17c / 2;
            local_f8[0]._4_4_ = (int)local_188 - (int)local_180 / 2;
            local_f8[0].obj = (void *)CONCAT44((int)local_180,(int)local_17c);
            std::vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>>::emplace_back<cv::Rect_<int>>
                      ((vector<cv::Rect_<int>,std::allocator<cv::Rect_<int>>> *)&local_128,
                       (Rect_<int> *)local_f8);
          }
          cv::Mat::~Mat((Mat *)&local_98);
          pMVar1 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pfVar9 = pfVar9 + *(int *)(pMVar1 + lVar8 + 0xc);
          local_98.start = iVar5;
        } while (iVar5 < *(int *)(pMVar1 + lVar8 + 8));
      }
      uVar7 = local_100 + 1;
      pMVar3 = (outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)(((long)(outs->super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 5) *
                            -0x5555555555555555));
  }
  local_98.start = 0;
  local_98.end = 0;
  RStack_90.start = 0;
  RStack_90.end = 0;
  local_88 = 0;
  cv::dnn::dnn4_v20211004::NMSBoxes
            ((vector *)&local_128,(vector *)&local_178,(float)*local_130,(float)*local_108,
             (vector *)&local_98,1.0,0);
  pvVar2 = local_110;
  frame_00 = local_138;
  if (RStack_90 != local_98) {
    uVar7 = 0;
    do {
      lVar6 = (long)*(int *)((long)local_98 + uVar7 * 4);
      lVar8 = lVar6 * 0x10;
      local_f8[0].flags = *(int *)((long)local_128 + lVar8);
      local_f8[0]._4_4_ = *(int *)((long)local_128 + lVar8 + 4);
      iVar5 = *(int *)((long)local_128 + lVar8 + 8);
      local_190.start = *(int *)((long)local_128 + lVar8 + 0xc);
      local_f8[0].obj = (void *)CONCAT44(local_190.start,iVar5);
      local_198.start = iVar5 + local_f8[0].flags;
      local_190.start = local_190.start + local_f8[0]._4_4_;
      DrawPred((pvVar2->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + *(int *)((long)local_158 + lVar6 * 4),
               local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start + lVar6,&local_f8[0].flags,
               (int *)&local_f8[0].field_0x4,&local_198.start,&local_190.start,frame_00);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)RStack_90 - (long)local_98 >> 2));
  }
  if (local_98 != (Range)0x0) {
    operator_delete((void *)local_98,local_88 - (long)local_98);
  }
  if (local_128 != (void *)0x0) {
    operator_delete(local_128,local_118 - (long)local_128);
  }
  if (local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_158 != (void *)0x0) {
    operator_delete(local_158,(long)local_148 - (long)local_158);
  }
  return;
}

Assistant:

void PostProcess(cv::Mat& frame, std::vector<cv::Mat> const& outs, std::vector<std::string> const& classes,
    double const& confThreshold, double const& nmsThreshold) noexcept {
  std::vector<int> classIds;
  std::vector<float> confidences;
  std::vector<cv::Rect> boxes;
  
  for (size_t i = 0; i < outs.size(); ++i) {
    /** Scan through all the bounding boxes output from the network and keep only the
     * ones with high confidence scores. Assign the box's class label as the class
     * with the highest score for the box.*/
    float* data = (float*)outs[i].data;
    for (int j = 0; j < outs[i].rows; ++j, data += outs[i].cols) {
      cv::Mat scores = outs[i].row(j).colRange(5, outs[i].cols);
      cv::Point classIdPoint;
      double confidence;
      //! Get the value and location of the maximum score
      cv::minMaxLoc(scores, 0, &confidence, 0, &classIdPoint);
      if (confidence > confThreshold) {
        int centerX = (int)(data[0] * frame.cols);
        int centerY = (int)(data[1] * frame.rows);
        int width = (int)(data[2] * frame.cols);
        int height = (int)(data[3] * frame.rows);
        int left = centerX - width / 2;
        int top = centerY - height / 2;
      
        classIds.push_back(classIdPoint.x);
        confidences.push_back((float)confidence);
        boxes.push_back(cv::Rect(left, top, width, height));
      }
    }
  }
  
  /** Perform non maximum suppression to eliminate redundant overlapping boxes with
   * lower confidences */
  std::vector<int> indices;
  cv::dnn::NMSBoxes(boxes, confidences, confThreshold, nmsThreshold, indices);
  for (size_t i = 0; i < indices.size(); ++i) {
    int idx = indices[i];
    cv::Rect box = boxes[idx];
    DrawPred(classes[classIds[idx]], confidences[idx], box.x, box.y,
        box.x + box.width, box.y + box.height, frame);
  }
}